

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O0

void __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::ParserTemplate(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                 *this,ColladaParserAutoGen14 *impl,IErrorHandler *errorHandler)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
  *this_00;
  IErrorHandler *in_stack_ffffffffffffffd8;
  ParserTemplateBase *in_stack_ffffffffffffffe0;
  
  ParserTemplateBase::ParserTemplateBase(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR__ParserTemplate_00db4800;
  this_00 = (stack<GeneratedSaxParser::NamespaceStackFrame,_std::deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>_>
             *)(in_RDI + 0x1a);
  std::
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
         *)0x8a8cf7);
  in_RDI[0x20] = this_00;
  in_RDI[0x21] = in_RSI;
  in_RDI[0x22] = 0;
  std::
  map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
  ::map((map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
         *)0x8a8d30);
  in_RDI[0x29] = 0;
  std::
  stack<GeneratedSaxParser::NamespaceStackFrame,std::deque<GeneratedSaxParser::NamespaceStackFrame,std::allocator<GeneratedSaxParser::NamespaceStackFrame>>>
  ::
  stack<std::deque<GeneratedSaxParser::NamespaceStackFrame,std::allocator<GeneratedSaxParser::NamespaceStackFrame>>,void>
            (this_00);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0x8a8d5f);
  *(undefined1 *)(in_RDI + 0x3a) = 0;
  in_RDI[0x3b] = 0;
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  return;
}

Assistant:

ParserTemplate(ImplClass* impl, IErrorHandler* errorHandler)
			:
		  ParserTemplateBase(errorHandler),
              mCurrentElementFunctionMap(&mElementFunctionMap),
			  mImpl(impl),
              mUnknownHandler(0),
              mActiveNamespaceHandler(0),
              mLaxNamespaceHandling(false),
			  mIgnoreElements(0),
              mUnknownElements(0),
              mNamespaceElements(0)
		  {}